

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O2

void UI::execute_volume_calculator(string *mesh_in)

{
  int iVar1;
  mesh_file in_mesh;
  allocator<char> local_c9;
  string local_c8;
  string local_a8;
  mesh_file local_88;
  
  MSH::mesh_file::mesh_file(&local_88);
  iVar1 = MSH::mesh_file::import_meshfile(&local_88,mesh_in);
  if (iVar1 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"Error: Mesh Import failed.",&local_c9);
    print_ln(&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  MSH::mesh_file::print_volumes(&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"Volume calculation ended.",&local_c9);
  print_ln(&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  MSH::mesh_file::~mesh_file(&local_88);
  return;
}

Assistant:

void UI::execute_volume_calculator(const std::string &mesh_in)
{
    MSH::mesh_file in_mesh;
    if (in_mesh.import_meshfile(mesh_in)) print_ln("Error: Mesh Import failed.");
    in_mesh.print_volumes();
    print_ln("Volume calculation ended.");
}